

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O0

void Pla_ManDumpBlif(Pla_Man_t *p,char *pFileName)

{
  char Entry;
  int iVar1;
  uint uVar2;
  uint Lit_00;
  uint Lit_01;
  uint Lit_02;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  Vec_Str_t *p_00;
  Vec_Int_t *p_01;
  int local_58;
  int pLits [3];
  int Div;
  int Lit;
  int k;
  int i;
  Vec_Int_t *vCube;
  Vec_Str_t *vStr;
  FILE *pFile;
  int nVarsInit;
  char *pFileName_local;
  Pla_Man_t *p_local;
  
  iVar1 = Pla_ManDivNum(p);
  if (iVar1 == 0) {
    local_58 = Pla_ManInNum(p);
  }
  else {
    local_58 = Vec_IntCountZero(&p->vDivs);
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  else {
    fprintf(__stream,"# BLIF file written via PLA package in ABC on ");
    pcVar5 = Extra_TimeStamp();
    fprintf(__stream,"%s",pcVar5);
    fprintf(__stream,"\n\n");
    pcVar5 = Pla_ManName(p);
    fprintf(__stream,".model %s\n",pcVar5);
    fprintf(__stream,".inputs");
    for (Lit = 0; Lit < local_58; Lit = Lit + 1) {
      fprintf(__stream," i%d",(ulong)(uint)Lit);
    }
    fprintf(__stream,"\n");
    fprintf(__stream,".outputs o");
    fprintf(__stream,"\n");
    fprintf(__stream,".names");
    for (Lit = 0; iVar1 = Pla_ManInNum(p), Lit < iVar1; Lit = Lit + 1) {
      fprintf(__stream," i%d",(ulong)(uint)Lit);
    }
    fprintf(__stream," o\n");
    iVar1 = Pla_ManInNum(p);
    p_00 = Vec_StrStart(iVar1 + 1);
    for (Lit = 0; iVar1 = Vec_WecSize(&p->vCubeLits), Lit < iVar1; Lit = Lit + 1) {
      p_01 = Vec_WecEntry(&p->vCubeLits,Lit);
      for (Div = 0; iVar1 = Pla_ManInNum(p), Div < iVar1; Div = Div + 1) {
        Vec_StrWriteEntry(p_00,Div,'-');
      }
      for (Div = 0; iVar1 = Vec_IntSize(p_01), Div < iVar1; Div = Div + 1) {
        iVar1 = Vec_IntEntry(p_01,Div);
        iVar4 = Abc_Lit2Var(iVar1);
        iVar1 = Abc_LitIsCompl(iVar1);
        Entry = '1';
        if (iVar1 != 0) {
          Entry = '0';
        }
        Vec_StrWriteEntry(p_00,iVar4,Entry);
      }
      pcVar5 = Vec_StrArray(p_00);
      fprintf(__stream,"%s 1\n",pcVar5);
    }
    Vec_StrFree(p_00);
    for (Lit = local_58; iVar1 = Vec_IntSize(&p->vDivs), Lit < iVar1; Lit = Lit + 1) {
      uVar2 = Vec_IntEntry(&p->vDivs,Lit);
      Lit_00 = (int)uVar2 >> 2 & 0x3ff;
      Lit_01 = (int)uVar2 >> 0xc & 0x3ff;
      Lit_02 = (int)uVar2 >> 0x16 & 0x3ff;
      fprintf(__stream,".names");
      uVar3 = Abc_Lit2Var(Lit_00);
      fprintf(__stream," i%d",(ulong)uVar3);
      uVar3 = Abc_Lit2Var(Lit_01);
      fprintf(__stream," i%d",(ulong)uVar3);
      if ((uVar2 & 3) == 3) {
        uVar3 = Abc_Lit2Var(Lit_02);
        fprintf(__stream," i%d",(ulong)uVar3);
      }
      fprintf(__stream," i%d\n",(ulong)(uint)Lit);
      if ((uVar2 & 3) == 1) {
        iVar1 = Abc_LitIsCompl(Lit_00);
        iVar4 = Abc_LitIsCompl(Lit_01);
        fprintf(__stream,"%d%d 1\n",(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                (ulong)((iVar4 != 0 ^ 0xffU) & 1));
      }
      else if ((uVar2 & 3) == 2) {
        iVar1 = Abc_LitIsCompl(Lit_00);
        if (iVar1 != 0) {
          __assert_fail("!Abc_LitIsCompl(pLits[0])",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                        ,0x89,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
        }
        iVar1 = Abc_LitIsCompl(Lit_01);
        if (iVar1 != 0) {
          __assert_fail("!Abc_LitIsCompl(pLits[1])",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                        ,0x8a,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
        }
        fprintf(__stream,"10 1\n01 1\n");
      }
      else {
        if ((uVar2 & 3) != 3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                        ,0x93,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
        }
        iVar1 = Abc_LitIsCompl(Lit_01);
        if (iVar1 != 0) {
          __assert_fail("!Abc_LitIsCompl(pLits[1])",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                        ,0x8f,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
        }
        iVar1 = Abc_LitIsCompl(Lit_02);
        if (iVar1 != 0) {
          __assert_fail("!Abc_LitIsCompl(pLits[2])",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                        ,0x90,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
        }
        iVar1 = Abc_LitIsCompl(Lit_00);
        fprintf(__stream,"%d-0 1\n-11 1\n",(ulong)((iVar1 != 0 ^ 0xffU) & 1));
      }
    }
    fprintf(__stream,".end\n\n");
    fclose(__stream);
    printf("Written file \"%s\".\n",pFileName);
  }
  return;
}

Assistant:

void Pla_ManDumpBlif( Pla_Man_t * p, char * pFileName )
{
    // find the number of original variables
    int nVarsInit = Pla_ManDivNum(p) ? Vec_IntCountZero(&p->vDivs) : Pla_ManInNum(p);
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
    else
    {
        //char * pLits = "-01?";
        Vec_Str_t * vStr;
        Vec_Int_t * vCube;
        int i, k, Lit, Div;
        // comment
        fprintf( pFile, "# BLIF file written via PLA package in ABC on " );
        fprintf( pFile, "%s", Extra_TimeStamp() );
        fprintf( pFile, "\n\n" );
        // header
        fprintf( pFile, ".model %s\n", Pla_ManName(p) );
        fprintf( pFile, ".inputs" );
        for ( i = 0; i < nVarsInit; i++ )
            fprintf( pFile, " i%d", i );
        fprintf( pFile, "\n" );
        fprintf( pFile, ".outputs o" );
        fprintf( pFile, "\n" );
        // SOP
        fprintf( pFile, ".names" );
        for ( i = 0; i < Pla_ManInNum(p); i++ )
            fprintf( pFile, " i%d", i );
        fprintf( pFile, " o\n" );
        vStr = Vec_StrStart( Pla_ManInNum(p) + 1 );
        Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
        {
            for ( k = 0; k < Pla_ManInNum(p); k++ )
                Vec_StrWriteEntry( vStr, k, '-' );
            Vec_IntForEachEntry( vCube, Lit, k )
                Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), (char)(Abc_LitIsCompl(Lit) ? '0' : '1') );
            fprintf( pFile, "%s 1\n", Vec_StrArray(vStr) );
        }
        Vec_StrFree( vStr );
        // divisors
        Vec_IntForEachEntryStart( &p->vDivs, Div, i, nVarsInit )
        {
            int pLits[3] = { (Div >> 2) & 0x3FF, (Div >> 12) & 0x3FF, (Div >> 22) & 0x3FF };
            fprintf( pFile, ".names" );
            fprintf( pFile, " i%d", Abc_Lit2Var(pLits[0]) );
            fprintf( pFile, " i%d", Abc_Lit2Var(pLits[1]) );
            if ( (Div & 3) == 3 ) // MUX
                fprintf( pFile, " i%d", Abc_Lit2Var(pLits[2]) );
            fprintf( pFile, " i%d\n", i );
            if ( (Div & 3) == 1 ) // AND
                fprintf( pFile, "%d%d 1\n", !Abc_LitIsCompl(pLits[0]), !Abc_LitIsCompl(pLits[1]) );
            else if ( (Div & 3) == 2 ) // XOR
            {
                assert( !Abc_LitIsCompl(pLits[0]) );
                assert( !Abc_LitIsCompl(pLits[1]) );
                fprintf( pFile, "10 1\n01 1\n" );
            }
            else if ( (Div & 3) == 3 ) // MUX
            {
                assert( !Abc_LitIsCompl(pLits[1]) );
                assert( !Abc_LitIsCompl(pLits[2]) );
                fprintf( pFile, "%d-0 1\n-11 1\n", !Abc_LitIsCompl(pLits[0]) );
            }
            else assert( 0 );
        }
        fprintf( pFile, ".end\n\n" );
        fclose( pFile );
        printf( "Written file \"%s\".\n", pFileName );
    }
}